

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int aux_close(lua_State *L)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  void *pvVar2;
  lua_CFunction cf;
  
  pvVar2 = luaL_checkudata(L,1,"FILE*");
  UNRECOVERED_JUMPTABLE = *(code **)((long)pvVar2 + 8);
  *(undefined8 *)((long)pvVar2 + 8) = 0;
  iVar1 = (*UNRECOVERED_JUMPTABLE)(L);
  return iVar1;
}

Assistant:

static int aux_close (lua_State *L) {
  LStream *p = tolstream(L);
  volatile lua_CFunction cf = p->closef;
  p->closef = NULL;  /* mark stream as closed */
  return (*cf)(L);  /* close it */
}